

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitBlock
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,Block *curr)

{
  Expression **ppEVar1;
  Type local_30;
  ulong local_28;
  size_t i;
  size_t n;
  Block *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  
  n = (size_t)curr;
  curr_local = (Block *)this;
  i = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                (&(curr->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  if (i != 0) {
    for (local_28 = 0; local_28 < i - 1; local_28 = local_28 + 1) {
      ppEVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (n + 0x20),local_28);
      wasm::Type::Type(&local_30,none);
      note(this,ppEVar1,local_30);
    }
    ppEVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         (n + 0x20));
    note(this,ppEVar1,(Type)*(uintptr_t *)(n + 8));
  }
  return;
}

Assistant:

void visitBlock(Block* curr) {
    size_t n = curr->list.size();
    if (n == 0) {
      return;
    }
    for (size_t i = 0; i < n - 1; ++i) {
      note(&curr->list[i], Type::none);
    }
    note(&curr->list.back(), curr->type);
  }